

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O3

bool __thiscall ON_WindowsBitmap::WriteUncompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  ON_WindowsBITMAPINFO *pOVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  ON__INT32 i;
  ulong uVar5;
  unsigned_short s;
  unsigned_short uVar6;
  int i_00;
  uint local_4c;
  uint local_48;
  ON__INT32 local_44;
  ON__INT32 local_40;
  uint local_3c;
  
  pOVar1 = this->m_bmi;
  if (pOVar1 == (ON_WindowsBITMAPINFO *)0x0) {
    i_00 = 0;
    uVar6 = 0;
    s = 0;
    uVar4 = 0;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    iVar3 = 0;
    i = 0;
  }
  else {
    iVar3 = (pOVar1->bmiHeader).biWidth;
    i_00 = (pOVar1->bmiHeader).biHeight;
    uVar6 = (pOVar1->bmiHeader).biPlanes;
    s = (pOVar1->bmiHeader).biBitCount;
    uVar4 = (pOVar1->bmiHeader).biCompression;
    local_3c = (pOVar1->bmiHeader).biSizeImage;
    local_40 = (pOVar1->bmiHeader).biXPelsPerMeter;
    local_44 = (pOVar1->bmiHeader).biYPelsPerMeter;
    local_48 = (pOVar1->bmiHeader).biClrUsed;
    local_4c = (pOVar1->bmiHeader).biClrImportant;
    i = 0x28;
  }
  bVar2 = ON_BinaryArchive::WriteInt(file,i);
  if ((((((!bVar2) || (bVar2 = ON_BinaryArchive::WriteInt(file,iVar3), !bVar2)) ||
        (bVar2 = ON_BinaryArchive::WriteInt(file,i_00), !bVar2)) ||
       (((bVar2 = ON_BinaryArchive::WriteShort(file,uVar6), !bVar2 ||
         (bVar2 = ON_BinaryArchive::WriteShort(file,s), !bVar2)) ||
        ((bVar2 = ON_BinaryArchive::WriteInt(file,uVar4), !bVar2 ||
         ((bVar2 = ON_BinaryArchive::WriteInt(file,local_3c), !bVar2 ||
          (bVar2 = ON_BinaryArchive::WriteInt(file,local_40), !bVar2)))))))) ||
      (bVar2 = ON_BinaryArchive::WriteInt(file,local_44), !bVar2)) ||
     (bVar2 = ON_BinaryArchive::WriteInt(file,local_48), !bVar2)) {
    return false;
  }
  bVar2 = ON_BinaryArchive::WriteInt(file,local_4c);
  if (!bVar2) {
    return false;
  }
  pOVar1 = this->m_bmi;
  bVar2 = true;
  uVar4 = 0;
  if (pOVar1 != (ON_WindowsBITMAPINFO *)0x0) {
    uVar4 = (pOVar1->bmiHeader).biClrUsed;
    if (uVar4 == 0) {
      uVar6 = (pOVar1->bmiHeader).biBitCount;
      if (uVar6 == 1) {
        uVar4 = 2;
      }
      else if (uVar6 == 8) {
        uVar4 = 0x100;
      }
      else {
        uVar4 = 0;
        if (uVar6 != 4) goto LAB_003d9bd0;
        uVar4 = 0x10;
      }
    }
    else if ((int)uVar4 < 1) goto LAB_003d9bd0;
    uVar5 = 0;
    while (((bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbBlue), bVar2
            && (bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbGreen),
               bVar2)) &&
           (bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbRed), bVar2)))
    {
      bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[uVar5].rgbReserved);
      uVar5 = uVar5 + 1;
      if ((uVar4 <= uVar5) || (!bVar2)) goto LAB_003d9bd0;
    }
    bVar2 = false;
  }
LAB_003d9bd0:
  iVar3 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1c])
                    (this);
  if (bVar2 != true || CONCAT44(extraout_var,iVar3) == 0) {
    return bVar2;
  }
  bVar2 = ON_BinaryArchive::WriteByte
                    (file,CONCAT44(extraout_var,iVar3),this->m_bmi->bmiColors + (int)uVar4);
  return bVar2;
}

Assistant:

bool ON_WindowsBitmap::WriteUncompressed( ON_BinaryArchive& file ) const
{
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif

  if ( m_bmi )
  {
    bmiHeader = m_bmi->bmiHeader;
    bmiHeader.biSize = sizeof(bmiHeader);
  }
  else 
  {
    memset(&bmiHeader,0,sizeof(bmiHeader));
  }
  int i;
  short s;
  i = bmiHeader.biSize;
  bool    rc = file.WriteInt(i);
  i = bmiHeader.biWidth;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biHeight;
  if (rc) rc = file.WriteInt(i);
  s = bmiHeader.biPlanes;
  if (rc) rc = file.WriteShort(s);
  s = bmiHeader.biBitCount;
  if (rc) rc = file.WriteShort(s);
  i = bmiHeader.biCompression;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biSizeImage;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biXPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biYPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrUsed;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrImportant;
  if (rc) rc = file.WriteInt(i);

  if ( rc ) 
  {
    const int color_count = PaletteColorCount();
    for (i = 0; i < color_count && rc; i++ )
    {
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbBlue );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbGreen );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbRed );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbReserved );
    }
    const size_t sizeof_image = SizeofImage();
    if ( sizeof_image > 0 && rc ) 
    {
      if (rc) rc = file.WriteByte( sizeof_image, &m_bmi->bmiColors[color_count] );
    }
  }

  return rc;
}